

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void * generate_func_and_redirect_to_bb_gen(MIR_context_t ctx,MIR_item_t func_item)

{
  undefined8 *puVar1;
  void *pvVar2;
  int iVar3;
  gen_ctx_t gen_ctx;
  MIR_item_t pMVar4;
  MIR_insn_t pMVar5;
  MIR_context_t ctx_00;
  long lVar6;
  void *pvVar7;
  MIR_insn_t *ppMVar8;
  MIR_insn_t pMVar9;
  MIR_lref_data *pMVar10;
  MIR_insn_t_conflict pMVar11;
  long lVar12;
  MIR_insn_t_conflict pMVar13;
  uint uVar14;
  size_t __size;
  void *addr;
  void *local_60;
  MIR_item_t local_58;
  MIR_context_t local_50;
  long local_48;
  void *local_40;
  void *local_38;
  
  __size = 0;
  generate_func_code(ctx,func_item,0);
  gen_ctx = ctx->gen_ctx;
  pMVar4 = gen_ctx->curr_func_item;
  pMVar11 = (((pMVar4->u).func)->insns).head;
  if (pMVar11 != (MIR_insn_t_conflict)0x0) {
    uVar14 = 1;
    lVar6 = 0;
    pMVar9 = pMVar11;
    do {
      iVar3 = *(int *)&pMVar9->field_0x18;
      pMVar5 = pMVar9;
      if (((uVar14 & 1) != 0) || (iVar3 == 0xb4)) {
        while ((pMVar13 = pMVar5, iVar3 == 0xb4 &&
               (pMVar5 = (pMVar13->insn_link).next, pMVar9 = pMVar13, pMVar5 != (MIR_insn_t)0x0))) {
          iVar3 = *(int *)&pMVar5->field_0x18;
        }
        lVar6 = lVar6 + 1;
      }
      iVar3 = (int)*(undefined8 *)&pMVar9->field_0x18;
      uVar14 = 1;
      if (iVar3 - 0xa5U < 0xffffffd1) {
        uVar14 = iVar3 - 0xa6;
        if (uVar14 < 0x13) {
          uVar14 = 0x60071 >> (uVar14 & 0x1f);
        }
        else {
          uVar14 = 0;
        }
      }
      pMVar9 = (pMVar9->insn_link).next;
    } while (pMVar9 != (MIR_insn_t)0x0);
    __size = lVar6 * 0x28;
  }
  ctx_00 = gen_ctx->ctx;
  local_50 = ctx;
  pvVar7 = malloc(__size);
  if (pvVar7 == (void *)0x0) {
    util_error(gen_ctx,"no memory");
  }
  pMVar4->data = pvVar7;
  if (pMVar11 == (MIR_insn_t_conflict)0x0) {
    lVar6 = 0;
  }
  else {
    uVar14 = 1;
    lVar6 = 0;
    do {
      if (((uVar14 & 1) != 0) || (*(int *)&pMVar11->field_0x18 == 0xb4)) {
        if (lVar6 != 0) {
          *(MIR_insn_t *)((long)pvVar7 + lVar6 * 0x28 + -8) = (pMVar11->insn_link).prev;
        }
        *(MIR_item_t *)((long)pvVar7 + lVar6 * 0x28 + 0x10) = pMVar4;
        *(MIR_insn_t_conflict *)((long)pvVar7 + lVar6 * 0x28 + 0x18) = pMVar11;
        puVar1 = (undefined8 *)((long)pvVar7 + lVar6 * 0x28);
        *puVar1 = 0;
        puVar1[1] = 0;
        if (*(int *)&pMVar11->field_0x18 == 0xb4) {
          pvVar2 = (void *)((long)pvVar7 + lVar6 * 0x28);
          pMVar11->data = pvVar2;
          for (pMVar13 = (pMVar11->insn_link).next;
              (pMVar13 != (MIR_insn_t_conflict)0x0 && (*(int *)&pMVar13->field_0x18 == 0xb4));
              pMVar13 = (pMVar13->insn_link).next) {
            pMVar13->data = pvVar2;
            pMVar11 = pMVar13;
          }
        }
        lVar6 = lVar6 + 1;
      }
      iVar3 = (int)*(undefined8 *)&pMVar11->field_0x18;
      uVar14 = 1;
      if (iVar3 - 0xa5U < 0xffffffd1) {
        uVar14 = iVar3 - 0xa6;
        if (uVar14 < 0x13) {
          uVar14 = 0x60071 >> (uVar14 & 0x1f);
        }
        else {
          uVar14 = 0;
        }
      }
      pMVar11 = (pMVar11->insn_link).next;
    } while (pMVar11 != (MIR_insn_t)0x0);
  }
  *(MIR_insn_t_conflict *)((long)pvVar7 + lVar6 * 0x28 + -8) = (((pMVar4->u).func)->insns).tail;
  local_58 = func_item;
  if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) &&
     (fwrite("BBs for lazy code generation:\n",0x1e,1,(FILE *)gen_ctx->debug_file), lVar6 != 0)) {
    lVar12 = 0;
    local_48 = lVar6;
    local_40 = pvVar7;
    do {
      pvVar2 = local_40;
      pvVar7 = (void *)((long)local_40 + lVar12 * 0x28);
      fprintf((FILE *)gen_ctx->debug_file,"  BBStub%llx:\n",pvVar7);
      ppMVar8 = (MIR_insn_t *)((long)pvVar2 + lVar12 * 0x28 + 0x18);
      do {
        pMVar11 = *ppMVar8;
        MIR_output_insn(ctx_00,gen_ctx->debug_file,pMVar11,(gen_ctx->curr_func_item->u).func,1);
        ppMVar8 = &(pMVar11->insn_link).next;
      } while (pMVar11 != *(MIR_insn_t_conflict *)((long)pvVar7 + 0x20));
      lVar12 = lVar12 + 1;
    } while (lVar12 != local_48);
  }
  pMVar10 = ((gen_ctx->curr_func_item->u).func)->first_lref;
  if (pMVar10 != (MIR_lref_data *)0x0) {
    do {
      get_bb_version(gen_ctx,(bb_stub_t)pMVar10->label->data,0,(spot_attr_t *)0x0,0,&local_60);
      if (pMVar10->label2 != (MIR_label_t)0x0) {
        get_bb_version(gen_ctx,(bb_stub_t)pMVar10->label2->data,0,(spot_attr_t *)0x0,0,&local_38);
        local_60 = (void *)((long)local_60 - (long)local_38);
      }
      local_60 = (void *)((long)local_60 + pMVar10->disp);
      *(void **)pMVar10->load_addr = local_60;
      pMVar10 = pMVar10->next;
    } while (pMVar10 != (MIR_lref_data *)0x0);
  }
  pMVar4 = local_58;
  get_bb_version(gen_ctx,(bb_stub_t)local_58->data,0,(spot_attr_t *)0x0,1,&local_60);
  _MIR_redirect_thunk(local_50,pMVar4->addr,local_60);
  return pMVar4->addr;
}

Assistant:

static void *generate_func_and_redirect_to_bb_gen (MIR_context_t ctx, MIR_item_t func_item) {
  generate_func_and_redirect (ctx, func_item, FALSE);
  return func_item->addr;
}